

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdVerify(Kit_DsdNtk_t *pNtk,uint *pTruth,int nVars)

{
  int iVar1;
  Kit_DsdMan_t *p;
  uint *pIn1;
  
  p = Kit_DsdManAlloc(nVars,(uint)pNtk->nVars + (uint)pNtk->nNodes + 2);
  pIn1 = Kit_DsdTruthCompute(p,pNtk);
  iVar1 = Extra_TruthIsEqual(pTruth,pIn1,nVars);
  if (iVar1 == 0) {
    puts("Verification failed.");
  }
  Kit_DsdManFree(p);
  return;
}

Assistant:

void Kit_DsdVerify( Kit_DsdNtk_t * pNtk, unsigned * pTruth, int nVars )
{
    Kit_DsdMan_t * p;
    unsigned * pTruthC;
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk)+2 );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Extra_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );
}